

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileMemory.cpp
# Opt level: O1

int __thiscall
MemoryProfiler::CreateArenaUsageSummary
          (MemoryProfiler *this,ArenaAllocator *alloc,bool liveOnly,LPWSTR **name_ptr,
          ArenaMemoryDataSummary ***summaries_ptr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 *puVar4;
  Type pSVar5;
  code *pcVar6;
  bool bVar7;
  BOOL BVar8;
  long lVar9;
  ulong uVar10;
  ArenaMemoryDataSummary *__src;
  ArenaMemoryDataSummary *arenaMemoryDataSummary;
  int iVar11;
  ulong uVar12;
  ArenaMemoryDataSummary **ppAVar13;
  size_t sVar14;
  int iVar15;
  long lVar16;
  LPWSTR *ppWVar17;
  ArenaMemoryData *memoryData;
  int iVar18;
  undefined8 *in_FS_OFFSET;
  
  if (alloc == (ArenaAllocator *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)*in_FS_OFFSET;
    *puVar4 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileMemory.cpp"
                       ,0x12a,"(alloc)","alloc");
    if (!bVar7) goto LAB_002cebee;
    *puVar4 = 0;
  }
  iVar1 = (this->arenaDataMap).count;
  iVar2 = (this->arenaDataMap).freeCount;
  ppWVar17 = (LPWSTR *)0x8;
  iVar18 = iVar1 - iVar2;
  lVar9 = (long)iVar18;
  if (iVar18 != 0) {
    sVar14 = 0xffffffffffffffff;
    if (-1 < iVar18) {
      sVar14 = lVar9 * 8;
    }
    BVar8 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar8 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)*in_FS_OFFSET;
      *puVar4 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar7) goto LAB_002cebee;
      *puVar4 = 0;
    }
    if (sVar14 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)*in_FS_OFFSET;
      *puVar4 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                         "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
      if (!bVar7) goto LAB_002cebee;
      *puVar4 = 0;
    }
    ppWVar17 = (LPWSTR *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               AllocInternal(&alloc->
                              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             ,sVar14);
    if (ppWVar17 == (LPWSTR *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)*in_FS_OFFSET;
      *puVar4 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar7) goto LAB_002cebee;
      *puVar4 = 0;
    }
  }
  *name_ptr = ppWVar17;
  uVar10 = (ulong)(this->arenaDataMap).bucketCount;
  if (uVar10 != 0) {
    iVar11 = 0;
    uVar12 = 0;
    do {
      iVar15 = (this->arenaDataMap).buckets[uVar12];
      while (iVar15 != -1) {
        pSVar5 = (this->arenaDataMap).entries;
        iVar3 = pSVar5[iVar15].
                super_DefaultHashedEntry<char16_t_*,_ArenaMemoryDataSummary_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<char16_t_*,_ArenaMemoryDataSummary_*>.
                super_ValueEntry<ArenaMemoryDataSummary_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<char16_t_*,_ArenaMemoryDataSummary_*>_>
                .super_KeyValueEntryDataLayout2<char16_t_*,_ArenaMemoryDataSummary_*>.next;
        lVar16 = (long)iVar11;
        iVar11 = iVar11 + 1;
        ppWVar17[lVar16] =
             pSVar5[iVar15].
             super_DefaultHashedEntry<char16_t_*,_ArenaMemoryDataSummary_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
             .super_KeyValueEntry<char16_t_*,_ArenaMemoryDataSummary_*>.
             super_ValueEntry<ArenaMemoryDataSummary_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<char16_t_*,_ArenaMemoryDataSummary_*>_>
             .super_KeyValueEntryDataLayout2<char16_t_*,_ArenaMemoryDataSummary_*>.key;
        iVar15 = iVar3;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar10);
  }
  JsUtil::
  QuickSort<Memory::_no_write_barrier_policy,_char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileMemory.cpp:311:42)>
  ::Sort(*name_ptr,lVar9);
  ppAVar13 = (ArenaMemoryDataSummary **)0x8;
  if (iVar1 != iVar2) {
    sVar14 = 0xffffffffffffffff;
    if (-1 < iVar18) {
      sVar14 = lVar9 * 8;
    }
    BVar8 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar8 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)*in_FS_OFFSET;
      *puVar4 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar7) goto LAB_002cebee;
      *puVar4 = 0;
    }
    if (sVar14 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)*in_FS_OFFSET;
      *puVar4 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                         "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
      if (!bVar7) goto LAB_002cebee;
      *puVar4 = 0;
    }
    ppAVar13 = (ArenaMemoryDataSummary **)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               AllocInternal(&alloc->
                              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             ,sVar14);
    if (ppAVar13 == (ArenaMemoryDataSummary **)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)*in_FS_OFFSET;
      *puVar4 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar7) {
LAB_002cebee:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar4 = 0;
    }
  }
  *summaries_ptr = ppAVar13;
  if (0 < iVar18) {
    lVar16 = 0;
    do {
      __src = JsUtil::
              BaseDictionary<char16_t_*,_ArenaMemoryDataSummary_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::Item(&this->arenaDataMap,*name_ptr + lVar16);
      memoryData = __src->data;
      if (liveOnly) {
        if (memoryData != (ArenaMemoryData *)0x0) {
          arenaMemoryDataSummary =
               (ArenaMemoryDataSummary *)new<Memory::ArenaAllocator>(0xd8,alloc,0x2cfcba);
          goto LAB_002cebae;
        }
        arenaMemoryDataSummary = (ArenaMemoryDataSummary *)0x0;
      }
      else {
        arenaMemoryDataSummary =
             (ArenaMemoryDataSummary *)new<Memory::ArenaAllocator>(0xd8,alloc,0x1c10d6);
        memcpy(arenaMemoryDataSummary,__src,0xd8);
LAB_002cebae:
        for (; memoryData != (ArenaMemoryData *)0x0; memoryData = memoryData->next) {
          arenaMemoryDataSummary->outstandingCount = arenaMemoryDataSummary->outstandingCount + 1;
          AccumulateData(arenaMemoryDataSummary,memoryData,false);
        }
        if (liveOnly) {
          arenaMemoryDataSummary->arenaCount = arenaMemoryDataSummary->outstandingCount;
        }
      }
      (*summaries_ptr)[lVar16] = arenaMemoryDataSummary;
      lVar16 = lVar16 + 1;
    } while (lVar16 != lVar9);
  }
  return iVar18;
}

Assistant:

int MemoryProfiler::CreateArenaUsageSummary(ArenaAllocator * alloc, bool liveOnly,
    _Outptr_result_buffer_(return) LPWSTR ** name_ptr, _Outptr_result_buffer_(return) ArenaMemoryDataSummary *** summaries_ptr)
{
    Assert(alloc);

    LPWSTR *& name = *name_ptr;
    ArenaMemoryDataSummary **& summaries = *summaries_ptr;

    int count = arenaDataMap.Count();
    name = AnewArray(alloc, LPWSTR, count);
    int i = 0;
    arenaDataMap.Map([&i, name](LPWSTR key, ArenaMemoryDataSummary*)
    {
        name[i++] = key;
    });

    qsort_s(name, count, sizeof(LPWSTR), [](void*, const void* a, const void* b) { return DefaultComparer<LPWSTR>::Compare(*(LPWSTR*)a, *(LPWSTR*)b); }, nullptr);

    summaries = AnewArray(alloc, ArenaMemoryDataSummary *, count);

    for (int j = 0; j < count; j++)
    {
        ArenaMemoryDataSummary * summary = arenaDataMap.Item(name[j]);
        ArenaMemoryData * data = summary->data;

        ArenaMemoryDataSummary * localSummary;
        if (liveOnly)
        {
            if (data == nullptr)
            {
                summaries[j] = nullptr;
                continue;
            }
            localSummary = AnewStructZ(alloc, ArenaMemoryDataSummary);
        }
        else
        {
            localSummary = Anew(alloc, ArenaMemoryDataSummary, *summary);
        }

        while (data != nullptr)
        {
            localSummary->outstandingCount++;
            AccumulateData(localSummary, data);
            data = data->next;
        }

        if (liveOnly)
        {
            localSummary->arenaCount = localSummary->outstandingCount;
        }
        summaries[j] = localSummary;
    }

    return count;
}